

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int x86PUSH(uchar *stream,int num)

{
  int iVar1;
  uchar uVar2;
  
  if ((char)(uchar)num == num) {
    stream[1] = (uchar)num;
    iVar1 = 2;
    uVar2 = 'j';
  }
  else {
    *(int *)(stream + 1) = num;
    iVar1 = 5;
    uVar2 = 'h';
  }
  *stream = uVar2;
  return iVar1;
}

Assistant:

int x86PUSH(unsigned char *stream, int num)
{
	unsigned char *start = stream;

	if((char)(num) == num)
	{
		*stream++ = 0x6a;
		stream += encodeImmByte(stream, (char)num);

		return int(stream - start);
	}

	*stream++ = 0x68;
	stream += encodeImmDword(stream, num);

	return int(stream - start);
}